

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommaInitializer.h
# Opt level: O2

CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> * __thiscall
Eigen::CommaInitializer<Eigen::Matrix<double,3,3,0,3,3>>::operator_
          (CommaInitializer<Eigen::Matrix<double,3,3,0,3,3>> *this,
          DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
          *other)

{
  CommaInitializer<Eigen::Matrix<double,3,3,0,3,3>> *pCVar1;
  long lVar2;
  uint __line;
  long lVar3;
  char *__assertion;
  Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_false> BStack_48;
  
  lVar3 = *(long *)(this + 0x10);
  if (lVar3 == 3) {
    lVar2 = *(long *)(this + 0x18);
    *(undefined8 *)(this + 0x10) = 0;
    pCVar1 = this + 8;
    lVar3 = *(long *)pCVar1;
    *(long *)pCVar1 = *(long *)pCVar1 + lVar2;
    *(undefined8 *)(this + 0x18) = 3;
    if (*(long *)pCVar1 != 0 && SCARRY8(lVar3,lVar2) == *(long *)pCVar1 < 0) {
      __assertion = 
      "m_row+m_currentBlockRows<=m_xpr.rows() && \"Too many rows passed to comma initializer (operator<<)\""
      ;
      __line = 0x5d;
      goto LAB_0013a8c8;
    }
    lVar3 = 0;
  }
  else if (2 < lVar3) {
    __assertion = 
    "(m_col + other.cols() <= m_xpr.cols()) && \"Too many coefficients passed to comma initializer (operator<<)\""
    ;
    __line = 0x60;
    goto LAB_0013a8c8;
  }
  if (*(long *)(this + 0x18) == 3) {
    Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_false>::Block
              (&BStack_48,*(Matrix<double,_3,_3,_0,_3,_3> **)this,*(Index *)(this + 8),lVar3,3,1);
    internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,3,1,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Matrix<double,3,1,0,3,1>const,Eigen::Matrix<double,3,1,0,3,1>const>>
              (&BStack_48,
               (CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
                *)other);
    *(long *)(this + 0x10) = *(long *)(this + 0x10) + 1;
    return (CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)this;
  }
  __assertion = "m_currentBlockRows==other.rows()";
  __line = 0x61;
LAB_0013a8c8:
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/ebu[P]libear/submodules/eigen/Eigen/src/Core/CommaInitializer.h"
                ,__line,
                "CommaInitializer<MatrixType> &Eigen::CommaInitializer<Eigen::Matrix<double, 3, 3>>::operator,(const DenseBase<OtherDerived> &) [MatrixType = Eigen::Matrix<double, 3, 3>, OtherDerived = Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>, const Eigen::Matrix<double, 3, 1>, const Eigen::Matrix<double, 3, 1>>]"
               );
}

Assistant:

EIGEN_DEVICE_FUNC
  CommaInitializer& operator,(const DenseBase<OtherDerived>& other)
  {
    if (m_col==m_xpr.cols() && (other.cols()!=0 || other.rows()!=m_currentBlockRows))
    {
      m_row+=m_currentBlockRows;
      m_col = 0;
      m_currentBlockRows = other.rows();
      eigen_assert(m_row+m_currentBlockRows<=m_xpr.rows()
        && "Too many rows passed to comma initializer (operator<<)");
    }
    eigen_assert((m_col + other.cols() <= m_xpr.cols())
      && "Too many coefficients passed to comma initializer (operator<<)");
    eigen_assert(m_currentBlockRows==other.rows());
    m_xpr.template block<OtherDerived::RowsAtCompileTime, OtherDerived::ColsAtCompileTime>
                    (m_row, m_col, other.rows(), other.cols()) = other;
    m_col += other.cols();
    return *this;
  }